

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

__m256i * convolve16_8tap_avx2(__m256i *ss,__m256i *coeffs)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i *in_RAX;
  
  auVar1 = vpmaddwd_avx2((undefined1  [32])*ss,(undefined1  [32])*coeffs);
  auVar2 = vpmaddwd_avx2((undefined1  [32])ss[1],(undefined1  [32])coeffs[1]);
  auVar3 = vpmaddwd_avx2((undefined1  [32])ss[2],(undefined1  [32])coeffs[2]);
  auVar4 = vpmaddwd_avx2((undefined1  [32])ss[3],(undefined1  [32])coeffs[3]);
  auVar1 = vpaddd_avx2(auVar2,auVar1);
  auVar2 = vpaddd_avx2(auVar3,auVar4);
  vpaddd_avx2(auVar1,auVar2);
  return in_RAX;
}

Assistant:

static inline __m256i convolve16_8tap_avx2(const __m256i ss[4],
                                           const __m256i coeffs[4]) {
  const __m256i res_01 = _mm256_madd_epi16(ss[0], coeffs[0]);
  const __m256i res_23 = _mm256_madd_epi16(ss[1], coeffs[1]);
  const __m256i res_45 = _mm256_madd_epi16(ss[2], coeffs[2]);
  const __m256i res_67 = _mm256_madd_epi16(ss[3], coeffs[3]);
  const __m256i res_0123 = _mm256_add_epi32(res_01, res_23);
  const __m256i res_4567 = _mm256_add_epi32(res_45, res_67);
  return _mm256_add_epi32(res_0123, res_4567);
}